

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::valGlue
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProStringList *varList,
          QString *before,QString *glue,QString *after)

{
  ProString *pPVar1;
  ProString *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  pPVar1 = (varList->super_QList<ProString>).d.ptr;
  for (this_00 = pPVar1; this_00 != pPVar1 + (varList->super_QList<ProString>).d.size;
      this_00 = this_00 + 1) {
    if (this_00->m_length != 0) {
      if (local_58.size != 0) {
        QString::append((QString *)&local_58);
      }
      ProString::toQString((QString *)&local_70,this_00);
      QString::append((QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      pPVar1 = (varList->super_QList<ProString>).d.ptr;
    }
  }
  if (local_58.size == 0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    local_70.d = (Data *)before;
    local_70.ptr = (char16_t *)&local_58;
    local_70.size = (qsizetype)after;
    QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&>::convertTo<QString>
              (__return_storage_ptr__,
               (QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_const_QString_&> *)
               &local_70);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valGlue(const ProStringList &varList, const QString &before, const QString &glue, const QString &after) const
{
    QString ret;
    for (ProStringList::ConstIterator it = varList.begin(); it != varList.end(); ++it) {
        if (!(*it).isEmpty()) {
            if (!ret.isEmpty())
                ret += glue;
            ret += (*it).toQString();
        }
    }
    return ret.isEmpty() ? QString("") : before + ret + after;
}